

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O0

Byte * __thiscall
CharStringType2Interpreter::InterpretIfelse
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  value_type vVar1;
  value_type vVar2;
  int iVar3;
  size_type sVar4;
  Trace *this_00;
  reference pvVar5;
  anon_union_8_2_3d487603_for_CharStringOperand_1 *paVar6;
  double local_98;
  double local_88;
  CharStringOperand valueD;
  CharStringOperand valueC;
  CharStringOperand valueB;
  CharStringOperand valueA;
  EStatusCode status;
  LongFilePositionType inReadLimit_local;
  Byte *inProgramCounter_local;
  CharStringType2Interpreter *this_local;
  
  iVar3 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x27])();
  if (iVar3 == 0) {
    sVar4 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                      (&this->mOperandStack);
    if (sVar4 < 4) {
      this_00 = Trace::DefaultTrace();
      sVar4 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::size
                        (&this->mOperandStack);
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretIfelse, ifelse should have at least 4 arguments on stack. got %d. aborting"
                        ,sVar4);
      this_local = (CharStringType2Interpreter *)0x0;
    }
    else {
      pvVar5 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      vVar1 = *pvVar5;
      local_98 = (double)(pvVar5->field_1).IntegerValue;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      pvVar5 = std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      vVar2 = *pvVar5;
      valueC._0_8_ = pvVar5->field_1;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      paVar6 = (anon_union_8_2_3d487603_for_CharStringOperand_1 *)
               std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      valueC.field_1 = *paVar6;
      valueB._0_8_ = paVar6[1];
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      paVar6 = (anon_union_8_2_3d487603_for_CharStringOperand_1 *)
               std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::back
                         (&this->mOperandStack);
      valueB.field_1 = *paVar6;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      this_local = (CharStringType2Interpreter *)inProgramCounter;
      if ((((undefined1  [16])vVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
         (((undefined1  [16])vVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
        if (((undefined1  [16])vVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          local_88 = (double)valueC._0_8_;
        }
        else {
          local_88 = (double)(long)valueC._0_8_;
        }
        if (((undefined1  [16])vVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_98 = (double)(long)local_98;
        }
        if (local_88 <= local_98) {
          std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                    (&this->mOperandStack,(value_type *)&valueB.field_1);
        }
        else {
          std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                    (&this->mOperandStack,(value_type *)&valueC.field_1);
        }
      }
      else if ((long)local_98 < (long)valueC._0_8_) {
        std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                  (&this->mOperandStack,(value_type *)&valueC.field_1);
      }
      else {
        std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::push_back
                  (&this->mOperandStack,(value_type *)&valueB.field_1);
      }
    }
  }
  else {
    this_local = (CharStringType2Interpreter *)0x0;
  }
  return (Byte *)this_local;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretIfelse(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Ifelse(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;
	CharStringOperand valueC;
	CharStringOperand valueD;

	if(mOperandStack.size() < 4) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretIfelse, ifelse should have at least 4 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}		

	valueD = mOperandStack.back();
	mOperandStack.pop_back();
	valueC = mOperandStack.back();
	mOperandStack.pop_back();
	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();


	if(!valueC.IsInteger || !valueD.IsInteger)
	{
		if((valueC.IsInteger ? (double)valueC.IntegerValue : valueC.RealValue) >
			(valueD.IsInteger ? (double)valueD.IntegerValue : valueD.RealValue))
			mOperandStack.push_back(valueB);
		else
			mOperandStack.push_back(valueA);
	}
	else
	{
		if(valueC.IntegerValue > valueD.IntegerValue)
			mOperandStack.push_back(valueB);
		else
			mOperandStack.push_back(valueA);
	}

	return inProgramCounter;
}